

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameLoop.cpp
# Opt level: O3

void GameLoop(Maze *maze)

{
  int iVar1;
  int iVar2;
  Room *this;
  ostream *poVar3;
  long *plVar4;
  Room *pRVar5;
  long lVar6;
  char *pcVar7;
  uint local_5c;
  string local_50;
  
  this = Maze::GetStart(maze);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Welcome to the maze game! Use command x to E(x)it at any time.",0x3e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  local_5c = std::ostream::flush();
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want room labels turned on? (y/n): ",0x2a);
    iVar1 = getchar();
    std::istream::ignore((long)&std::cin,1000);
    iVar2 = tolower((int)(char)iVar1);
    if (iVar2 == 0x79) {
      local_5c = 1;
    }
    else if (iVar2 == 0x6e) {
      local_5c = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid input, try again.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
    }
    iVar1 = tolower((int)(char)iVar1);
  } while ((iVar1 != 0x79) && (iVar1 != 0x6e));
  pRVar5 = Maze::GetEnd(maze);
  if (this != pRVar5) {
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      poVar3 = (ostream *)std::ostream::flush();
      if ((local_5c & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"You are in a room",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"You are in a room with label: \'",0x1f);
        Room::GetLabel_abi_cxx11_(&local_50,this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You can go: ",0xc);
      pRVar5 = Room::GetRoom(this,NORTH);
      if (pRVar5 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(n)orth  ",9);
      }
      pRVar5 = Room::GetRoom(this,EAST);
      if (pRVar5 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(e)ast  ",8);
      }
      pRVar5 = Room::GetRoom(this,SOUTH);
      if (pRVar5 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(s)outh  ",9);
      }
      pRVar5 = Room::GetRoom(this,WEST);
      if (pRVar5 != (Room *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(w)est  ",8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please enter your command: ",0x1b);
      iVar1 = getchar();
      std::istream::ignore((long)&std::cin,1000);
      iVar1 = tolower((int)(char)iVar1);
      if (iVar1 < 0x73) {
        if (iVar1 == 0x65) {
          pRVar5 = Room::GetRoom(this,EAST);
          if (pRVar5 == (Room *)0x0) goto LAB_00102f61;
          lVar6 = 0x1c;
          pcVar7 = "Moving one room to the east.";
        }
        else {
          if (iVar1 != 0x6e) goto LAB_00102f7b;
          pRVar5 = Room::GetRoom(this,NORTH);
          if (pRVar5 == (Room *)0x0) goto LAB_00102f61;
          lVar6 = 0x1d;
          pcVar7 = "Moving one room to the north.";
        }
LAB_00102f57:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
        this = pRVar5;
      }
      else {
        if (iVar1 == 0x73) {
          pRVar5 = Room::GetRoom(this,SOUTH);
          if (pRVar5 != (Room *)0x0) {
            lVar6 = 0x1d;
            pcVar7 = "Moving one room to the south.";
            goto LAB_00102f57;
          }
LAB_00102f61:
          lVar6 = 0x17;
          pcVar7 = "You cannot go that way.";
        }
        else {
          if (iVar1 == 0x77) {
            pRVar5 = Room::GetRoom(this,WEST);
            if (pRVar5 == (Room *)0x0) goto LAB_00102f61;
            lVar6 = 0x1c;
            pcVar7 = "Moving one room to the west.";
            goto LAB_00102f57;
          }
          if (iVar1 == 0x78) {
            Maze::GetEnd(maze);
            pcVar7 = "We hope you come to play again!";
            lVar6 = 0x1f;
            goto LAB_00102fdc;
          }
LAB_00102f7b:
          lVar6 = 0x10;
          pcVar7 = "Invalid command!";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      pRVar5 = Maze::GetEnd(maze);
    } while (this != pRVar5);
  }
  pcVar7 = "Congratulations! You made it to the end! Now exiting.";
  lVar6 = 0x35;
LAB_00102fdc:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void GameLoop(Maze* maze)
{
    Room* currentRoom = maze->GetStart();
    bool exit = false;
    bool displayLabels;
    char labels;

    std::cout << std::endl << "Welcome to the maze game! Use command x to E(x)it at any time." << std::endl << std::endl;

    do
    {
        std::cout << "Do you want room labels turned on? (y/n): ";
        labels = std::getchar();
        std::cin.ignore(1000, '\n');

        if(tolower(labels) == 'y')
            displayLabels = true;
        else if(tolower(labels) == 'n')
            displayLabels = false;
        else
            std::cout << "Invalid input, try again." << std::endl << std::endl;

    } while(tolower(labels) != 'y' && tolower(labels) != 'n');

    while(currentRoom != maze->GetEnd() && !exit)
    {
        char command;

        if(displayLabels)
            std::cout << std::endl << "You are in a room with label: '" << currentRoom->GetLabel() << "'"<< std::endl;
        else
            std::cout << std::endl << "You are in a room" << std::endl;
        std::cout << "You can go: ";
        if(currentRoom->GetRoom(NORTH) != NULL)
            std::cout << "(n)orth  ";
        if(currentRoom->GetRoom(EAST) != NULL)
            std::cout << "(e)ast  ";
        if(currentRoom->GetRoom(SOUTH) != NULL)
            std::cout << "(s)outh  ";
        if(currentRoom->GetRoom(WEST) != NULL)
            std::cout << "(w)est  ";
        std::cout << std::endl;

        std::cout << "Please enter your command: ";
        command = std::getchar();
        std::cin.ignore(1000, '\n');

        switch(tolower(command))
        {
            case 'n':
            {
                Room *tmpRoom = currentRoom->GetRoom(NORTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the north." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'e':
            {
                Room *tmpRoom = currentRoom->GetRoom(EAST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the east." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 's':
            {
                Room *tmpRoom = currentRoom->GetRoom(SOUTH);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the south." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'w':
            {
                Room *tmpRoom = currentRoom->GetRoom(WEST);
                if (tmpRoom == NULL)
                    std::cout << "You cannot go that way." << std::endl;
                else
                {
                    std::cout << "Moving one room to the west." << std::endl;
                    currentRoom = tmpRoom;
                }

                break;
            }
            case 'x':
            {
                exit = true;
                break;
            }
            default:
            {
                std::cout << "Invalid command!" << std::endl;
            }
        }

    }

    if(exit)
    {
        std::cout << "We hope you come to play again!" << std::endl;
    }
    else
    {
        std::cout << "Congratulations! You made it to the end! Now exiting." << std::endl;
        return;
    }
}